

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::commands::show_help(commands *this)

{
  uint uVar1;
  int iVar2;
  debug *this_00;
  reference ppcVar3;
  ulong uVar4;
  string *psVar5;
  string *psVar6;
  reference ppcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  FILE *in_RSI;
  bool bVar10;
  double __x;
  _List_const_iterator<libchars::command_*> local_b8;
  command *local_b0;
  command *cmd_1;
  undefined1 local_a0 [24];
  const_iterator mi;
  command *local_80;
  command *cmd;
  iterator local_70;
  const_iterator ci;
  uint match_max_length;
  command_list_t match;
  _IO_FILE *local_38;
  token *T;
  string cmd_str_search;
  commands *this_local;
  
  cmd_str_search.field_2._8_8_ = this;
  printf("?\n");
  switch(this->status) {
  case VALID_COMMAND:
  case MISSING_VALUE:
  case INVALID_ARG:
  case TOO_FEW_ARGS:
  case TOO_MANY_ARGS:
    show_parameters(this);
    break;
  case EMPTY:
  case PARTIAL_COMMAND:
    if (this->cmd == (command *)0x0) {
      std::__cxx11::string::string((string *)&T);
      local_38 = (_IO_FILE *)this->t_cmd;
      while( true ) {
        bVar10 = false;
        if (local_38 != (_IO_FILE *)0x0) {
          bVar10 = *(size_t *)&local_38->_cur_column != 0;
        }
        if (!bVar10) break;
        this_00 = debug::initialize(0);
        __x = (double)std::__cxx11::string::c_str();
        debug::log(this_00,__x);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&T,' ');
        }
        std::__cxx11::string::append((string *)&T);
        if (((token *)local_38->_lock == (token *)0x0) &&
           (local_38->_old_offset + *(size_t *)&local_38->_cur_column <
            (this->super_edit_object).insert_idx)) {
          std::__cxx11::string::operator+=((string *)&T,' ');
        }
        local_38 = (_IO_FILE *)local_38->_lock;
      }
      std::__cxx11::list<libchars::command_*,_std::allocator<libchars::command_*>_>::list
                ((list<libchars::command_*,_std::allocator<libchars::command_*>_> *)
                 &stack0xffffffffffffffa0);
      ci._M_node._4_4_ = 0;
      local_70 = std::
                 set<libchars::command_*,_libchars::command_sort_criteria,_std::allocator<libchars::command_*>_>
                 ::begin(&this->C_sorted);
LAB_0012ace8:
      cmd = (command *)
            std::
            set<libchars::command_*,_libchars::command_sort_criteria,_std::allocator<libchars::command_*>_>
            ::end(&this->C_sorted);
      bVar10 = std::operator!=(&stack0xffffffffffffff90,(_Self *)&cmd);
      if (bVar10) {
        mi._M_node = (_List_node_base *)
                     std::_Rb_tree_const_iterator<libchars::command_*>::operator++
                               (&stack0xffffffffffffff90,0);
        ppcVar3 = std::_Rb_tree_const_iterator<libchars::command_*>::operator*
                            ((_Rb_tree_const_iterator<libchars::command_*> *)&mi);
        local_80 = *ppcVar3;
        if (((local_80->mask & this->mask) != 0) && ((local_80->hidden & 1U) == 0)) {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            psVar5 = &local_80->cmd_str;
            psVar6 = (string *)std::__cxx11::string::length();
            iVar2 = std::__cxx11::string::compare((ulong)psVar5,0,psVar6);
            if (iVar2 != 0) goto LAB_0012ace8;
          }
          std::__cxx11::list<libchars::command_*,_std::allocator<libchars::command_*>_>::push_back
                    ((list<libchars::command_*,_std::allocator<libchars::command_*>_> *)
                     &stack0xffffffffffffffa0,&stack0xffffffffffffff80);
          uVar4 = std::__cxx11::string::length();
          if (ci._M_node._4_4_ < uVar4) {
            ci._M_node._4_4_ = std::__cxx11::string::length();
          }
        }
        goto LAB_0012ace8;
      }
      local_a0._8_8_ =
           std::__cxx11::list<libchars::command_*,_std::allocator<libchars::command_*>_>::begin
                     ((list<libchars::command_*,_std::allocator<libchars::command_*>_> *)
                      &stack0xffffffffffffffa0);
      std::_List_const_iterator<libchars::command_*>::_List_const_iterator
                ((_List_const_iterator<libchars::command_*> *)(local_a0 + 0x10),
                 (iterator *)(local_a0 + 8));
      while( true ) {
        cmd_1 = (command *)
                std::__cxx11::list<libchars::command_*,_std::allocator<libchars::command_*>_>::end
                          ((list<libchars::command_*,_std::allocator<libchars::command_*>_> *)
                           &stack0xffffffffffffffa0);
        std::_List_const_iterator<libchars::command_*>::_List_const_iterator
                  ((_List_const_iterator<libchars::command_*> *)local_a0,(iterator *)&cmd_1);
        in_RSI = (FILE *)local_a0;
        bVar10 = std::operator!=((_Self *)(local_a0 + 0x10),(_Self *)in_RSI);
        if (!bVar10) break;
        local_b8._M_node =
             (_List_node_base *)
             std::_List_const_iterator<libchars::command_*>::operator++
                       ((_List_const_iterator<libchars::command_*> *)(local_a0 + 0x10),0);
        ppcVar7 = std::_List_const_iterator<libchars::command_*>::operator*(&local_b8);
        uVar1 = ci._M_node._4_4_;
        local_b0 = *ppcVar7;
        uVar8 = std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        printf("%-*s : %s\n",(ulong)uVar1,uVar8,uVar9);
      }
      std::__cxx11::list<libchars::command_*,_std::allocator<libchars::command_*>_>::~list
                ((list<libchars::command_*,_std::allocator<libchars::command_*>_> *)
                 &stack0xffffffffffffffa0);
      std::__cxx11::string::~string((string *)&T);
    }
    else {
      printf("** INTERNAL ERROR: partial command **\n");
    }
    break;
  case NO_COMMAND:
    printf("No known commands match current line\n");
    break;
  case TERMINATED:
  case TIMEOUT:
  case FORCED_RETURN:
  }
  edit_object::rewind(&this->super_edit_object,in_RSI);
  return;
}

Assistant:

void commands::show_help()
    {
        printf("?\n");

        //TODO: use terminal driver to print strings
        //TODO: pretty-print (e.g. start help in same column)

        switch (status) {
        case TERMINATED:
        case TIMEOUT:
        case FORCED_RETURN:
            // ignore
            break;
        case VALID_COMMAND:
        case MISSING_VALUE:
        case INVALID_ARG:
        case TOO_FEW_ARGS:
        case TOO_MANY_ARGS:
            // command known --> dump parameter help
            show_parameters();
            break;
        case NO_COMMAND:
            // invalid command --> cannot show help
            printf("No known commands match current line\n");
            break;
        case EMPTY:
        case PARTIAL_COMMAND:
            // empty / partially known --> find list of commands that match partial string
            if (cmd != NULL) {
                printf("** INTERNAL ERROR: partial command **\n");
            }
            else {
                std::string cmd_str_search;
                token *T = t_cmd;
                while (T != NULL && T->length > 0) {
                    LC_LOG_VERBOSE("search token [%p/%s@%zu+%zu]",T,T->value.c_str(),T->offset,T->length);
                    if (!cmd_str_search.empty())
                        cmd_str_search += ' ';
                    cmd_str_search.append(T->value);
                    if (T->next == NULL && insert_idx > (T->offset + T->length))
                        cmd_str_search += ' ';
                    T = T->next;
                }
                // build match list
                typedef std::list<command*> command_list_t;
                command_list_t match;
                unsigned int match_max_length = 0;
                command_sorted_list_t::const_iterator ci = C_sorted.begin();
                while (ci != C_sorted.end()) {
                    command *cmd = *ci++;
                    if ((cmd->mask & mask) != 0 && !cmd->hidden && (cmd_str_search.empty() || cmd->cmd_str.compare(0,cmd_str_search.length(),cmd_str_search) == 0)) {
                        match.push_back(cmd);
                        if (cmd->cmd_str.length() > match_max_length)
                            match_max_length = cmd->cmd_str.length();
                    }
                }
                // dump match list
                command_list_t::const_iterator mi = match.begin();
                while (mi != match.end()) {
                    const command *cmd = *mi++;
                    printf("%-*s : %s\n", match_max_length, cmd->cmd_str.c_str(), cmd->help.c_str());
                }
            }
            break;
        }

        rewind();
    }